

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O0

object * __thiscall
jessilib::deserialize_object
          (object *__return_storage_ptr__,jessilib *this,u8string_view in_data,string *in_format)

{
  basic_string_view<char8_t,_std::char_traits<char8_t>_> in_text;
  element_type *this_00;
  shared_ptr<jessilib::parser> local_38;
  string *local_28;
  string *in_format_local;
  u8string_view in_data_local;
  
  local_28 = (string *)in_data._M_str;
  in_data_local._M_len = in_data._M_len;
  in_format_local = (string *)this;
  in_data_local._M_str = (char8_t *)__return_storage_ptr__;
  get_parser((jessilib *)&local_38,local_28);
  this_00 = std::__shared_ptr_access<jessilib::parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<jessilib::parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&local_38);
  in_text._M_str = (char8_t *)in_data_local._M_len;
  in_text._M_len = (size_t)in_format_local;
  parser::deserialize<char8_t>(__return_storage_ptr__,this_00,in_text);
  std::shared_ptr<jessilib::parser>::~shared_ptr(&local_38);
  return __return_storage_ptr__;
}

Assistant:

object deserialize_object(std::u8string_view in_data, const std::string& in_format) {
	return get_parser(in_format)->deserialize(in_data);
}